

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O3

int rsa_alt_check_pair(void *pub,void *prv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  mbedtls_rsa_context *rsa;
  mbedtls_rsa_alt_context *rsa_alt;
  uchar hash [32];
  uchar sig [1024];
  
  uVar3 = (**(code **)((long)prv + 0x18))(*prv);
  sVar4 = mbedtls_rsa_get_len((mbedtls_rsa_context *)pub);
  iVar1 = -0x4200;
  if (((sVar4 ^ uVar3) & 0x1fffffffffffffff) == 0) {
    builtin_memcpy(hash + 0x10,"****************",0x10);
    builtin_memcpy(hash,"****************",0x10);
    sVar4 = (**(code **)((long)prv + 0x18))(*prv);
    iVar1 = (**(code **)((long)prv + 0x10))(*prv,0,0,1,0,0x20,hash,sig);
    if (iVar1 == 0) {
      iVar2 = rsa_verify_wrap(pub,MBEDTLS_MD_NONE,hash,0x20,sig,sVar4);
      iVar1 = -0x4200;
      if (iVar2 == 0) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int rsa_alt_check_pair( const void *pub, const void *prv )
{
    unsigned char sig[MBEDTLS_MPI_MAX_SIZE];
    unsigned char hash[32];
    size_t sig_len = 0;
    int ret;

    if( rsa_alt_get_bitlen( prv ) != rsa_get_bitlen( pub ) )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    memset( hash, 0x2a, sizeof( hash ) );

    if( ( ret = rsa_alt_sign_wrap( (void *) prv, MBEDTLS_MD_NONE,
                                   hash, sizeof( hash ),
                                   sig, &sig_len, NULL, NULL ) ) != 0 )
    {
        return( ret );
    }

    if( rsa_verify_wrap( (void *) pub, MBEDTLS_MD_NONE,
                         hash, sizeof( hash ), sig, sig_len ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    return( 0 );
}